

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict
process_tag(c2m_ctx_t c2m_ctx,node_t_conflict r,node_t_conflict id,node_t_conflict decl_list)

{
  char *pcVar1;
  size_t sVar2;
  node_t_conflict pnVar3;
  bool bVar4;
  pos_t pVar5;
  DLIST_node_t temp;
  undefined8 local_98;
  char *local_90;
  undefined8 local_88;
  node_t_conflict tab_decl_list;
  node_t_conflict scope;
  undefined1 local_68 [4];
  int found_p;
  symbol_t sym;
  check_ctx_t check_ctx;
  node_t_conflict decl_list_local;
  node_t_conflict id_local;
  node_t_conflict r_local;
  c2m_ctx_t c2m_ctx_local;
  
  sym.defs = (VARR_node_t *)c2m_ctx->check_ctx;
  c2m_ctx_local = (c2m_ctx_t)r;
  if (id->code == N_ID) {
    tab_decl_list = ((check_ctx *)sym.defs)->curr_scope;
    while( true ) {
      bVar4 = false;
      if ((tab_decl_list != c2m_ctx->top_scope) && (bVar4 = true, tab_decl_list->code != N_STRUCT))
      {
        bVar4 = tab_decl_list->code == N_UNION;
      }
      if (!bVar4) break;
      tab_decl_list = *(node_t_conflict *)((long)tab_decl_list->attr + 0x20);
    }
    sym.scope = (node_t_conflict)0x0;
    if (decl_list->code == N_IGNORE) {
      sym.scope = find_def(c2m_ctx,S_TAG,id,tab_decl_list,(node_t_conflict *)0x0);
      scope._4_4_ = (uint)(sym.scope != (node_t_conflict)0x0);
    }
    else {
      scope._4_4_ = symbol_find(c2m_ctx,S_TAG,id,tab_decl_list,(symbol_t *)local_68);
    }
    id_local = r;
    if (scope._4_4_ == 0) {
      symbol_insert(c2m_ctx,S_TAG,id,tab_decl_list,r,(node_t_conflict)0x0);
    }
    else if ((sym.scope)->code == r->code) {
      pnVar3 = DLIST_node_t_el(&((sym.scope)->u).ops,1);
      if ((pnVar3->code == N_IGNORE) || (decl_list->code == N_IGNORE)) {
        if (decl_list->code != N_IGNORE) {
          pcVar1 = (r->u).s.s;
          sVar2 = (r->u).s.len;
          (r->u).s.s = ((sym.scope)->u).s.s;
          (r->u).s.len = ((sym.scope)->u).s.len;
          ((sym.scope)->u).s.s = pcVar1;
          ((sym.scope)->u).s.len = sVar2;
        }
        id_local = sym.scope;
      }
      else {
        pVar5 = get_node_pos(c2m_ctx,id);
        temp.tail = (node_t)pVar5.fname;
        local_98 = pVar5._8_8_;
        error(c2m_ctx,0x1d63c2,(char *)temp.tail,local_98,(id->u).s.s);
      }
    }
    else {
      pVar5 = get_node_pos(c2m_ctx,id);
      local_90 = pVar5.fname;
      local_88 = pVar5._8_8_;
      error(c2m_ctx,0x1d638c,local_90,local_88,(id->u).s.s);
    }
    c2m_ctx_local = (c2m_ctx_t)id_local;
  }
  return (node_t_conflict)c2m_ctx_local;
}

Assistant:

static node_t process_tag (c2m_ctx_t c2m_ctx, node_t r, node_t id, node_t decl_list) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;
  symbol_t sym;
  int found_p;
  node_t scope, tab_decl_list;

  if (id->code != N_ID) return r;
  scope = curr_scope;
  while (scope != top_scope && (scope->code == N_STRUCT || scope->code == N_UNION))
    scope = ((struct node_scope *) scope->attr)->scope;
  sym.def_node = NULL; /* to remove uninitialized warning */
  if (decl_list->code != N_IGNORE) {
    found_p = symbol_find (c2m_ctx, S_TAG, id, scope, &sym);
  } else {
    sym.def_node = find_def (c2m_ctx, S_TAG, id, scope, NULL);
    found_p = sym.def_node != NULL;
  }
  if (!found_p) {
    symbol_insert (c2m_ctx, S_TAG, id, scope, r, NULL);
  } else if (sym.def_node->code != r->code) {
    error (c2m_ctx, POS (id), "kind of tag %s is unmatched with previous declaration", id->u.s.s);
  } else if ((tab_decl_list = NL_EL (sym.def_node->u.ops, 1))->code != N_IGNORE
             && decl_list->code != N_IGNORE) {
    error (c2m_ctx, POS (id), "tag %s redeclaration", id->u.s.s);
  } else {
    if (decl_list->code != N_IGNORE) { /* swap decl lists */
      DLIST (node_t) temp;
      SWAP (r->u.ops, sym.def_node->u.ops, temp);
    }
    r = sym.def_node;
  }
  return r;
}